

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O3

void Extra_MmStepEntryRecycle(Extra_MmStep_t *p,char *pEntry,int nBytes)

{
  Extra_MmFixed_t *pEVar1;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    pEVar1 = p->pMap[nBytes];
    pEVar1->nEntriesUsed = pEVar1->nEntriesUsed + -1;
    *(char **)pEntry = pEVar1->pEntriesFree;
    pEVar1->pEntriesFree = pEntry;
  }
  return;
}

Assistant:

void Extra_MmStepEntryRecycle( Extra_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Extra_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}